

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O3

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  undefined1 auVar1 [16];
  UINT8 UVar2;
  k051649_state *info;
  DEV_DATA DVar3;
  uint uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  DVar3.chipInf = calloc(1,0xf0);
  if (DVar3.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(UINT8 *)((long)DVar3.chipInf + 0xee) = cfg->flags;
    uVar4 = cfg->clock;
    *(uint *)((long)DVar3.chipInf + 0xe4) = uVar4;
    uVar4 = uVar4 >> 4;
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0xe8))->chipInf = uVar4;
    auVar1 = _DAT_00172610;
    lVar5 = 0x5e;
    auVar6 = _DAT_00172600;
    do {
      if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffffb) {
        *(undefined1 *)((long)DVar3.chipInf + lVar5 + -0x2c) = 0;
        *(undefined1 *)((long)DVar3.chipInf + lVar5) = 0;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x58;
    } while (lVar5 != 0x166);
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar4;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}